

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Scanner::scanFlowScalar(Scanner *this,bool IsDoubleQuoted)

{
  uint AtColumn;
  iterator pcVar1;
  iterator pcVar2;
  IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
  *pIVar3;
  bool bVar4;
  bool local_ca;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_c0;
  iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
  local_b8;
  undefined1 local_a0 [8];
  Token T;
  iterator i;
  uint ColStart;
  iterator Start;
  bool IsDoubleQuoted_local;
  Scanner *this_local;
  
  pcVar1 = this->Current;
  AtColumn = this->Column;
  if (IsDoubleQuoted) {
    do {
      this->Current = this->Current + 1;
      while( true ) {
        bVar4 = false;
        if (this->Current != this->End) {
          bVar4 = *this->Current != '\"';
        }
        if (!bVar4) break;
        this->Current = this->Current + 1;
      }
      local_ca = false;
      if ((this->Current != this->End) && (local_ca = false, this->Current[-1] == '\\')) {
        local_ca = wasEscaped(pcVar1 + 1,this->Current);
      }
    } while (local_ca != false);
  }
  else {
    skip(this,1);
    while( true ) {
      while (((this->Current + 1 < this->End && (*this->Current == '\'')) &&
             (this->Current[1] == '\''))) {
        skip(this,2);
      }
      if (*this->Current == '\'') break;
      pcVar2 = skip_nb_char(this,this->Current);
      if (pcVar2 == this->Current) {
        pcVar2 = skip_b_break(this,this->Current);
        if (pcVar2 == this->Current) break;
        this->Current = pcVar2;
        this->Column = 0;
        this->Line = this->Line + 1;
      }
      else {
        if (pcVar2 == this->End) break;
        this->Current = pcVar2;
        this->Column = this->Column + 1;
      }
    }
  }
  bVar4 = this->Current != this->End;
  if (bVar4) {
    skip(this,1);
    Token::Token((Token *)local_a0);
    local_a0._0_4_ = TK_Scalar;
    T.Range.Data = this->Current + -(long)pcVar1;
    T._0_8_ = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)local_a0);
    local_c0.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
           ::end(&this->TokenQueue);
    pIVar3 = iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
             ::operator--(&local_c0);
    local_b8.I.NodePtr =
         (ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>
          )(pIVar3->
           super_iterator_adaptor_base<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>,_std::bidirectional_iterator_tag,_llvm::yaml::Token,_long,_llvm::yaml::Token_*,_llvm::yaml::Token_&,_std::iterator_traits<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>_>
           ).I.NodePtr;
    saveSimpleKeyCandidate(this,(iterator)local_b8.I.NodePtr,AtColumn,false);
    this->IsSimpleKeyAllowed = false;
    Token::~Token((Token *)local_a0);
  }
  else {
    Twine::Twine((Twine *)((long)&T.Value.field_2 + 8),"Expected quote at end of scalar");
    setError(this,(Twine *)((long)&T.Value.field_2 + 8),this->Current);
  }
  return bVar4;
}

Assistant:

bool Scanner::scanFlowScalar(bool IsDoubleQuoted) {
  StringRef::iterator Start = Current;
  unsigned ColStart = Column;
  if (IsDoubleQuoted) {
    do {
      ++Current;
      while (Current != End && *Current != '"')
        ++Current;
      // Repeat until the previous character was not a '\' or was an escaped
      // backslash.
    } while (   Current != End
             && *(Current - 1) == '\\'
             && wasEscaped(Start + 1, Current));
  } else {
    skip(1);
    while (true) {
      // Skip a ' followed by another '.
      if (Current + 1 < End && *Current == '\'' && *(Current + 1) == '\'') {
        skip(2);
        continue;
      } else if (*Current == '\'')
        break;
      StringRef::iterator i = skip_nb_char(Current);
      if (i == Current) {
        i = skip_b_break(Current);
        if (i == Current)
          break;
        Current = i;
        Column = 0;
        ++Line;
      } else {
        if (i == End)
          break;
        Current = i;
        ++Column;
      }
    }
  }

  if (Current == End) {
    setError("Expected quote at end of scalar", Current);
    return false;
  }

  skip(1); // Skip ending quote.
  Token T;
  T.Kind = Token::TK_Scalar;
  T.Range = StringRef(Start, Current - Start);
  TokenQueue.push_back(T);

  saveSimpleKeyCandidate(--TokenQueue.end(), ColStart, false);

  IsSimpleKeyAllowed = false;

  return true;
}